

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetTXTransformf(ndicapi *pol,int portHandle,float *transform)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar2 = pol->TxHandleCount;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  do {
    if (uVar6 == uVar4) {
LAB_00108198:
      iVar3 = 1;
      if ((uint)uVar6 != uVar2) {
        cVar1 = pol->TxTransforms[uVar6][0];
        if ((cVar1 != '\0') && (cVar1 != 'D')) {
          if (cVar1 == 'M') {
            iVar3 = 2;
          }
          else {
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6],6);
            *transform = (float)lVar5 * 0.0001;
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6] + 6,6);
            transform[1] = (float)lVar5 * 0.0001;
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6] + 0xc,6);
            transform[2] = (float)lVar5 * 0.0001;
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6] + 0x12,6);
            transform[3] = (float)lVar5 * 0.0001;
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6] + 0x18,7);
            transform[4] = (float)lVar5 * 0.01;
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6] + 0x1f,7);
            transform[5] = (float)lVar5 * 0.01;
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6] + 0x26,7);
            transform[6] = (float)lVar5 * 0.01;
            lVar5 = ndiSignedToLong(pol->TxTransforms[uVar6] + 0x2d,6);
            transform[7] = (float)lVar5 * 0.0001;
            iVar3 = 0;
          }
        }
      }
      return iVar3;
    }
    if ((uint)pol->TxHandles[uVar4] == portHandle) {
      uVar6 = uVar4 & 0xffffffff;
      goto LAB_00108198;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

ndicapiExport int ndiGetTXTransformf(ndicapi* pol, int portHandle, float transform[8])
{
  char* readPointer;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  readPointer = pol->TxTransforms[i];
  if (*readPointer == 'D' || *readPointer == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*readPointer == 'M')
  {
    return NDI_MISSING;
  }

  transform[0] = ndiSignedToLong(&readPointer[0],  6) * 0.0001f;
  transform[1] = ndiSignedToLong(&readPointer[6],  6) * 0.0001f;
  transform[2] = ndiSignedToLong(&readPointer[12], 6) * 0.0001f;
  transform[3] = ndiSignedToLong(&readPointer[18], 6) * 0.0001f;
  transform[4] = ndiSignedToLong(&readPointer[24], 7) * 0.01f;
  transform[5] = ndiSignedToLong(&readPointer[31], 7) * 0.01f;
  transform[6] = ndiSignedToLong(&readPointer[38], 7) * 0.01f;
  transform[7] = ndiSignedToLong(&readPointer[45], 6) * 0.0001f;

  return NDI_OKAY;
}